

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O2

TestType * __thiscall TestType::operator=(TestType *this,TestType *other)

{
  uint __line;
  size_type sVar1;
  char *__assertion;
  TestType *local_18;
  
  local_18 = this;
  sVar1 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::count(&constructed,&local_18);
  if (sVar1 == 1) {
    local_18 = other;
    sVar1 = std::
            set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>::
            count(&constructed,&local_18);
    if (sVar1 == 1) {
      return this;
    }
    __assertion = "constructed.count(&other) == 1";
    __line = 0x39;
  }
  else {
    __assertion = "constructed.count(this) == 1";
    __line = 0x38;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,__line,"TestType &TestType::operator=(TestType &&)");
}

Assistant:

TestType &operator=(TestType &&other) noexcept {
    assert(constructed.count(this) == 1);
    assert(constructed.count(&other) == 1);
    return *this;
  }